

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void windowAggStep(WindowCodeArg *p,Window *pMWin,int csr,int bInverse,int reg)

{
  u8 uVar1;
  Parse *pParse;
  ExprList *pEVar2;
  FuncDef *p_00;
  int p3;
  byte bVar3;
  int iVar4;
  int iVar5;
  Vdbe *p_01;
  Op *pOVar6;
  long lVar7;
  CollSeq *zP4;
  int p2;
  long lVar8;
  Window *pWVar9;
  u8 *puVar10;
  int iVar11;
  int local_4c;
  
  pParse = p->pParse;
  p_01 = sqlite3GetVdbe(pParse);
  if (pMWin != (Window *)0x0) {
    pWVar9 = pMWin;
    do {
      iVar4 = 0;
      if ((pWVar9->bExprArgs == '\0') &&
         (pEVar2 = (pWVar9->pOwner->x).pList, pEVar2 != (ExprList *)0x0)) {
        iVar4 = pEVar2->nExpr;
      }
      p_00 = pWVar9->pWFunc;
      if (0 < iVar4) {
        iVar11 = 0;
        do {
          if ((iVar11 == 1) && (p_00->zName == "nth_value")) {
            iVar5 = pMWin->iEphCsr;
            p2 = pWVar9->iArgCol + 1;
            p3 = reg + 1;
          }
          else {
            p2 = pWVar9->iArgCol + iVar11;
            iVar5 = csr;
            p3 = reg + iVar11;
          }
          sqlite3VdbeAddOp3(p_01,0x5e,iVar5,p2,p3);
          iVar11 = iVar11 + 1;
        } while (iVar4 != iVar11);
      }
      if (pWVar9->pFilter == (Expr *)0x0) {
        iVar11 = 0;
      }
      else {
        if (pParse->nTempReg == '\0') {
          iVar5 = pParse->nMem + 1;
          pParse->nMem = iVar5;
        }
        else {
          bVar3 = pParse->nTempReg - 1;
          pParse->nTempReg = bVar3;
          iVar5 = pParse->aTempReg[bVar3];
        }
        sqlite3VdbeAddOp3(p_01,0x5e,csr,pWVar9->iArgCol + iVar4,iVar5);
        iVar11 = sqlite3VdbeAddOp3(p_01,0x11,iVar5,0,1);
        if (iVar5 != 0) {
          bVar3 = pParse->nTempReg;
          if ((ulong)bVar3 < 8) {
            pParse->nTempReg = bVar3 + 1;
            pParse->aTempReg[bVar3] = iVar5;
          }
        }
      }
      if (((pMWin->regStartRowid == 0) && ((p_00->funcFlags & 0x1000) != 0)) &&
         (pWVar9->eStart != '[')) {
        iVar4 = sqlite3VdbeAddOp3(p_01,0x33,reg,0,0);
        if (bInverse == 0) {
          sqlite3VdbeAddOp3(p_01,0x56,pWVar9->regApp + 1,1,0);
          sqlite3VdbeAddOp3(p_01,0x51,reg,pWVar9->regApp,0);
          sqlite3VdbeAddOp3(p_01,0x61,pWVar9->regApp,2,pWVar9->regApp + 2);
          sqlite3VdbeAddOp3(p_01,0x8a,pWVar9->csrApp,pWVar9->regApp + 2,0);
        }
        else {
          sqlite3VdbeAddOp4Int(p_01,0x17,pWVar9->csrApp,0,reg,1);
          sqlite3VdbeAddOp3(p_01,0x82,pWVar9->csrApp,0,0);
          pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
          if (p_01->db->mallocFailed == '\0') {
            pOVar6 = p_01->aOp + (long)p_01->nOp + -2;
          }
          pOVar6->p2 = p_01->nOp;
        }
        pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p_01->db->mallocFailed == '\0') {
          pOVar6 = p_01->aOp + iVar4;
        }
        pOVar6->p2 = p_01->nOp;
      }
      else if (pWVar9->regApp == 0) {
        if (p_00->xSFunc != noopStepFunc) {
          local_4c = reg;
          if (pWVar9->bExprArgs != '\0') {
            iVar5 = p_01->nOp;
            iVar4 = ((pWVar9->pOwner->x).pList)->nExpr;
            local_4c = sqlite3GetTempRange(pParse,iVar4);
            sqlite3ExprCodeExprList(pParse,(pWVar9->pOwner->x).pList,local_4c,0,'\0');
            if (iVar5 < p_01->nOp) {
              uVar1 = p_01->db->mallocFailed;
              lVar8 = (long)iVar5 * 0x18;
              lVar7 = (long)p_01->nOp - (long)iVar5;
              do {
                puVar10 = &sqlite3VdbeGetOp_dummy;
                if (uVar1 == '\0') {
                  puVar10 = &p_01->aOp->opcode + lVar8;
                }
                if ((*puVar10 == '^') && (*(int *)(puVar10 + 4) == pMWin->iEphCsr)) {
                  *(int *)(puVar10 + 4) = csr;
                }
                lVar8 = lVar8 + 0x18;
                lVar7 = lVar7 + -1;
              } while (lVar7 != 0);
            }
          }
          if ((p_00->funcFlags & 0x20) != 0) {
            zP4 = sqlite3ExprCollSeq(pParse,((pWVar9->pOwner->x).pList)->a[0].pExpr);
            if (zP4 == (CollSeq *)0x0) {
              zP4 = pParse->db->pDfltColl;
            }
            iVar5 = sqlite3VdbeAddOp3(p_01,0x55,0,0,0);
            sqlite3VdbeChangeP4(p_01,iVar5,(char *)zP4,-2);
          }
          sqlite3VdbeAddOp3(p_01,(bInverse == 0) + 0xa1,bInverse,local_4c,pWVar9->regAccum);
          if (p_01->db->mallocFailed == '\0') {
            pOVar6 = p_01->aOp;
            iVar5 = p_01->nOp;
            pOVar6[(long)iVar5 + -1].p4type = -7;
            pOVar6[(long)iVar5 + -1].p4.pKeyInfo = (KeyInfo *)p_00;
          }
          else if ((p_00->funcFlags & 0x10) != 0) {
            sqlite3DbNNFreeNN(p_01->db,p_00);
          }
          if (0 < (long)p_01->nOp) {
            p_01->aOp[(long)p_01->nOp + -1].p5 = (u16)iVar4;
          }
          if (pWVar9->bExprArgs != '\0') {
            if (iVar4 == 1) {
              if (local_4c != 0) {
                bVar3 = pParse->nTempReg;
                if ((ulong)bVar3 < 8) {
                  pParse->nTempReg = bVar3 + 1;
                  pParse->aTempReg[bVar3] = local_4c;
                }
              }
            }
            else if (pParse->nRangeReg < iVar4) {
              pParse->nRangeReg = iVar4;
              pParse->iRangeReg = local_4c;
            }
          }
        }
      }
      else {
        sqlite3VdbeAddOp3(p_01,0x56,(pWVar9->regApp - bInverse) + 1,1,0);
      }
      if (iVar11 != 0) {
        pOVar6 = (Op *)&sqlite3VdbeGetOp_dummy;
        if (p_01->db->mallocFailed == '\0') {
          pOVar6 = p_01->aOp + iVar11;
        }
        pOVar6->p2 = p_01->nOp;
      }
      pWVar9 = pWVar9->pNextWin;
    } while (pWVar9 != (Window *)0x0);
  }
  return;
}

Assistant:

static void windowAggStep(
  WindowCodeArg *p,
  Window *pMWin,                  /* Linked list of window functions */
  int csr,                        /* Read arguments from this cursor */
  int bInverse,                   /* True to invoke xInverse instead of xStep */
  int reg                         /* Array of registers */
){
  Parse *pParse = p->pParse;
  Vdbe *v = sqlite3GetVdbe(pParse);
  Window *pWin;
  for(pWin=pMWin; pWin; pWin=pWin->pNextWin){
    FuncDef *pFunc = pWin->pWFunc;
    int regArg;
    int nArg = pWin->bExprArgs ? 0 : windowArgCount(pWin);
    int i;
    int addrIf = 0;

    assert( bInverse==0 || pWin->eStart!=TK_UNBOUNDED );

    /* All OVER clauses in the same window function aggregate step must
    ** be the same. */
    assert( pWin==pMWin || sqlite3WindowCompare(pParse,pWin,pMWin,0)!=1 );

    for(i=0; i<nArg; i++){
      if( i!=1 || pFunc->zName!=nth_valueName ){
        sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+i, reg+i);
      }else{
        sqlite3VdbeAddOp3(v, OP_Column, pMWin->iEphCsr, pWin->iArgCol+i, reg+i);
      }
    }
    regArg = reg;

    if( pWin->pFilter ){
      int regTmp;
      assert( ExprUseXList(pWin->pOwner) );
      assert( pWin->bExprArgs || !nArg ||nArg==pWin->pOwner->x.pList->nExpr );
      assert( pWin->bExprArgs || nArg  ||pWin->pOwner->x.pList==0 );
      regTmp = sqlite3GetTempReg(pParse);
      sqlite3VdbeAddOp3(v, OP_Column, csr, pWin->iArgCol+nArg,regTmp);
      addrIf = sqlite3VdbeAddOp3(v, OP_IfNot, regTmp, 0, 1);
      VdbeCoverage(v);
      sqlite3ReleaseTempReg(pParse, regTmp);
    }

    if( pMWin->regStartRowid==0
     && (pFunc->funcFlags & SQLITE_FUNC_MINMAX)
     && (pWin->eStart!=TK_UNBOUNDED)
    ){
      int addrIsNull = sqlite3VdbeAddOp1(v, OP_IsNull, regArg);
      VdbeCoverage(v);
      if( bInverse==0 ){
        sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1, 1);
        sqlite3VdbeAddOp2(v, OP_SCopy, regArg, pWin->regApp);
        sqlite3VdbeAddOp3(v, OP_MakeRecord, pWin->regApp, 2, pWin->regApp+2);
        sqlite3VdbeAddOp2(v, OP_IdxInsert, pWin->csrApp, pWin->regApp+2);
      }else{
        sqlite3VdbeAddOp4Int(v, OP_SeekGE, pWin->csrApp, 0, regArg, 1);
        VdbeCoverageNeverTaken(v);
        sqlite3VdbeAddOp1(v, OP_Delete, pWin->csrApp);
        sqlite3VdbeJumpHere(v, sqlite3VdbeCurrentAddr(v)-2);
      }
      sqlite3VdbeJumpHere(v, addrIsNull);
    }else if( pWin->regApp ){
      assert( pWin->pFilter==0 );
      assert( pFunc->zName==nth_valueName
           || pFunc->zName==first_valueName
      );
      assert( bInverse==0 || bInverse==1 );
      sqlite3VdbeAddOp2(v, OP_AddImm, pWin->regApp+1-bInverse, 1);
    }else if( pFunc->xSFunc!=noopStepFunc ){
      if( pWin->bExprArgs ){
        int iOp = sqlite3VdbeCurrentAddr(v);
        int iEnd;

        assert( ExprUseXList(pWin->pOwner) );
        nArg = pWin->pOwner->x.pList->nExpr;
        regArg = sqlite3GetTempRange(pParse, nArg);
        sqlite3ExprCodeExprList(pParse, pWin->pOwner->x.pList, regArg, 0, 0);

        for(iEnd=sqlite3VdbeCurrentAddr(v); iOp<iEnd; iOp++){
          VdbeOp *pOp = sqlite3VdbeGetOp(v, iOp);
          if( pOp->opcode==OP_Column && pOp->p1==pMWin->iEphCsr ){
            pOp->p1 = csr;
          }
        }
      }
      if( pFunc->funcFlags & SQLITE_FUNC_NEEDCOLL ){
        CollSeq *pColl;
        assert( nArg>0 );
        assert( ExprUseXList(pWin->pOwner) );
        pColl = sqlite3ExprNNCollSeq(pParse, pWin->pOwner->x.pList->a[0].pExpr);
        sqlite3VdbeAddOp4(v, OP_CollSeq, 0,0,0, (const char*)pColl, P4_COLLSEQ);
      }
      sqlite3VdbeAddOp3(v, bInverse? OP_AggInverse : OP_AggStep,
                        bInverse, regArg, pWin->regAccum);
      sqlite3VdbeAppendP4(v, pFunc, P4_FUNCDEF);
      sqlite3VdbeChangeP5(v, (u16)nArg);
      if( pWin->bExprArgs ){
        sqlite3ReleaseTempRange(pParse, regArg, nArg);
      }
    }

    if( addrIf ) sqlite3VdbeJumpHere(v, addrIf);
  }
}